

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

void nni_resolv(nni_resolv_item *item,nni_aio *aio)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  nni_aio *aio_local;
  nni_resolv_item *item_local;
  
  nni_aio_reset(aio);
  if ((item->ri_host == (char *)0x0) ||
     ((sVar3 = strlen(item->ri_host), sVar3 < 0x100 &&
      (iVar2 = strcmp(item->ri_host,"*"), iVar2 != 0)))) {
    nni_mtx_lock(&resolv_mtx);
    nni_aio_set_prov_data(aio,item);
    _Var1 = nni_aio_start(aio,resolv_cancel,item);
    if (_Var1) {
      if ((resolv_fini & 1U) == 0) {
        nni_list_append(&resolv_aios,aio);
        nni_cv_wake1(&resolv_cv);
        nni_mtx_unlock(&resolv_mtx);
      }
      else {
        nni_mtx_unlock(&resolv_mtx);
        nni_aio_finish_error(aio,NNG_ECLOSED);
      }
    }
    else {
      nni_mtx_unlock(&resolv_mtx);
    }
  }
  else {
    nni_aio_finish_error(aio,NNG_EADDRINVAL);
  }
  return;
}

Assistant:

void
nni_resolv(nni_resolv_item *item, nni_aio *aio)
{
	nni_aio_reset(aio);
	if (item->ri_host != NULL) {
		if ((strlen(item->ri_host) >= 256) ||
		    (strcmp(item->ri_host, "*") == 0)) {
			nni_aio_finish_error(aio, NNG_EADDRINVAL);
			return;
		}
	}

	nni_mtx_lock(&resolv_mtx);
	nni_aio_set_prov_data(aio, item);
	if (!nni_aio_start(aio, resolv_cancel, item)) {
		nni_mtx_unlock(&resolv_mtx);
		return;
	}

	if (resolv_fini) {
		nni_mtx_unlock(&resolv_mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	nni_list_append(&resolv_aios, aio);
	nni_cv_wake1(&resolv_cv);
	nni_mtx_unlock(&resolv_mtx);
}